

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbstrmatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_>::Clone
          (TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0x130);
  TPZSBandStructMatrix((TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_> *)this_00,this);
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZSBandStructMatrix(*this);
}